

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O3

GENERAL_NAME *
v2i_GENERAL_NAME_ex(GENERAL_NAME *out,X509V3_EXT_METHOD *method,X509V3_CTX *ctx,CONF_VALUE *cnf,
                   int is_nc)

{
  int iVar1;
  GENERAL_NAME *a;
  X509_NAME *nm;
  size_t sVar2;
  ASN1_OCTET_STRING *pAVar3;
  ASN1_OBJECT *pAVar4;
  char *pcVar5;
  OTHERNAME *a_00;
  char *pcVar6;
  ASN1_TYPE *pAVar7;
  stack_st_CONF_VALUE *dn_sk;
  int iVar8;
  
  pcVar6 = cnf->value;
  if (pcVar6 == (char *)0x0) {
    ERR_put_error(0x14,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1f5);
    return (GENERAL_NAME *)0x0;
  }
  pcVar5 = cnf->name;
  iVar1 = x509v3_conf_name_matches(pcVar5,"email");
  iVar8 = 1;
  if (iVar1 == 0) {
    iVar1 = x509v3_conf_name_matches(pcVar5,"URI");
    iVar8 = 6;
    if (iVar1 == 0) {
      iVar1 = x509v3_conf_name_matches(pcVar5,"DNS");
      iVar8 = 2;
      if (iVar1 == 0) {
        iVar1 = x509v3_conf_name_matches(pcVar5,"RID");
        iVar8 = 8;
        if (iVar1 == 0) {
          iVar1 = x509v3_conf_name_matches(pcVar5,"IP");
          iVar8 = 7;
          if (iVar1 == 0) {
            iVar1 = x509v3_conf_name_matches(pcVar5,"dirName");
            iVar8 = 4;
            if (iVar1 == 0) {
              iVar1 = x509v3_conf_name_matches(pcVar5,"otherName");
              iVar8 = 0;
              if (iVar1 == 0) {
                ERR_put_error(0x14,0,0xa0,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                              ,0x209);
                ERR_add_error_data(2,"name=",pcVar5);
                return (GENERAL_NAME *)0x0;
              }
            }
          }
        }
      }
    }
  }
  a = out;
  if ((out == (GENERAL_NAME *)0x0) && (a = GENERAL_NAME_new(), a == (GENERAL_NAME *)0x0)) {
    return (GENERAL_NAME *)0x0;
  }
  switch(iVar8) {
  case 0:
    pcVar5 = strchr(pcVar6,0x3b);
    if ((pcVar5 != (char *)0x0) && (a_00 = OTHERNAME_new(), a_00 != (OTHERNAME *)0x0)) {
      pcVar6 = OPENSSL_strndup(pcVar6,(long)pcVar5 - (long)pcVar6);
      if (pcVar6 != (char *)0x0) {
        ASN1_OBJECT_free(a_00->type_id);
        pAVar4 = OBJ_txt2obj(pcVar6,0);
        a_00->type_id = pAVar4;
        OPENSSL_free(pcVar6);
        if (a_00->type_id != (ASN1_OBJECT *)0x0) {
          ASN1_TYPE_free(a_00->value);
          pAVar7 = ASN1_generate_v3(pcVar5 + 1,ctx);
          a_00->value = pAVar7;
          if (pAVar7 != (ASN1_TYPE *)0x0) {
            a->type = 0;
            (a->d).otherName = a_00;
            return a;
          }
        }
      }
      OTHERNAME_free(a_00);
    }
    iVar1 = 0x94;
    iVar8 = 0x1dc;
    break;
  case 1:
  case 2:
  case 6:
    nm = (X509_NAME *)ASN1_IA5STRING_new();
    if (nm != (X509_NAME *)0x0) {
      sVar2 = strlen(pcVar6);
      iVar1 = ASN1_STRING_set((ASN1_STRING *)nm,pcVar6,(int)sVar2);
      if (iVar1 != 0) {
        a->type = iVar8;
LAB_0031f60e:
        (a->d).rfc822Name = (ASN1_IA5STRING *)nm;
        return a;
      }
    }
    ASN1_STRING_free((ASN1_STRING *)nm);
    goto LAB_0031f881;
  default:
    ERR_put_error(0x14,0,0xa1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1e1);
    goto LAB_0031f881;
  case 4:
    dn_sk = X509V3_get_section(ctx,pcVar6);
    nm = X509_NAME_new();
    if (nm != (X509_NAME *)0x0) {
      if (dn_sk == (stack_st_CONF_VALUE *)0x0) {
        ERR_put_error(0x14,0,0x99,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                      ,0x240);
        ERR_add_error_data(2,"section=",pcVar6);
      }
      else {
        iVar1 = X509V3_NAME_from_section(nm,dn_sk,0x1001);
        if (iVar1 != 0) {
          a->type = 4;
          goto LAB_0031f60e;
        }
      }
    }
    X509_NAME_free(nm);
    iVar1 = 0x69;
    iVar8 = 0x1d5;
    break;
  case 7:
    a->type = 7;
    if (is_nc == 0) {
      pAVar3 = a2i_IPADDRESS(pcVar6);
    }
    else {
      pAVar3 = a2i_IPADDRESS_NC(pcVar6);
    }
    (a->d).iPAddress = pAVar3;
    if (pAVar3 != (ASN1_OCTET_STRING *)0x0) {
      return a;
    }
    iVar1 = 100;
    iVar8 = 0x1cd;
    goto LAB_0031f7e0;
  case 8:
    pAVar4 = OBJ_txt2obj(pcVar6,0);
    if (pAVar4 != (ASN1_OBJECT *)0x0) {
      a->type = 8;
      (a->d).registeredID = pAVar4;
      return a;
    }
    iVar1 = 0x65;
    iVar8 = 0x1bc;
LAB_0031f7e0:
    ERR_put_error(0x14,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,iVar8);
    ERR_add_error_data(2,"value=",pcVar6);
    goto LAB_0031f881;
  }
  ERR_put_error(0x14,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                ,iVar8);
LAB_0031f881:
  if (out == (GENERAL_NAME *)0x0) {
    GENERAL_NAME_free(a);
  }
  return (GENERAL_NAME *)0x0;
}

Assistant:

GENERAL_NAME *v2i_GENERAL_NAME_ex(GENERAL_NAME *out,
                                  const X509V3_EXT_METHOD *method,
                                  const X509V3_CTX *ctx, const CONF_VALUE *cnf,
                                  int is_nc) {
  const char *name = cnf->name;
  const char *value = cnf->value;
  if (!value) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
    return NULL;
  }

  int type;
  if (x509v3_conf_name_matches(name, "email")) {
    type = GEN_EMAIL;
  } else if (x509v3_conf_name_matches(name, "URI")) {
    type = GEN_URI;
  } else if (x509v3_conf_name_matches(name, "DNS")) {
    type = GEN_DNS;
  } else if (x509v3_conf_name_matches(name, "RID")) {
    type = GEN_RID;
  } else if (x509v3_conf_name_matches(name, "IP")) {
    type = GEN_IPADD;
  } else if (x509v3_conf_name_matches(name, "dirName")) {
    type = GEN_DIRNAME;
  } else if (x509v3_conf_name_matches(name, "otherName")) {
    type = GEN_OTHERNAME;
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNSUPPORTED_OPTION);
    ERR_add_error_data(2, "name=", name);
    return NULL;
  }

  return a2i_GENERAL_NAME(out, method, ctx, type, value, is_nc);
}